

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O2

int64_t intra_model_rd(AV1_COMMON *cm,MACROBLOCK *x,int plane,BLOCK_SIZE plane_bsize,TX_SIZE tx_size
                      ,int use_hadamard)

{
  int iVar1;
  int iVar2;
  int cols;
  int rows;
  int iVar3;
  int iVar4;
  uint src_stride;
  undefined7 in_register_00000009;
  int blk_row;
  uint uVar5;
  int blk_col;
  ulong uVar6;
  undefined7 in_register_00000081;
  ulong uVar7;
  long lVar8;
  macroblock_plane *pmVar9;
  BitDepthInfo bd_info;
  uint local_80;
  
  uVar6 = (ulong)(uint)((int)CONCAT71(in_register_00000081,tx_size) * 4);
  uVar7 = CONCAT71(in_register_00000009,plane_bsize) & 0xffffffff;
  iVar1 = (x->e_mbd).mb_to_right_edge;
  src_stride = (uint)block_size_wide[uVar7];
  local_80 = src_stride;
  if (iVar1 < 0) {
    local_80 = (iVar1 >> ((char)(x->e_mbd).plane[(uint)plane].subsampling_x + 3U & 0x1f)) +
               src_stride;
  }
  uVar5 = (uint)block_size_high[uVar7];
  iVar1 = (x->e_mbd).mb_to_bottom_edge;
  if (iVar1 < 0) {
    uVar5 = (uint)block_size_high[uVar7] +
            (iVar1 >> ((char)(x->e_mbd).plane[(uint)plane].subsampling_y + 3U & 0x1f));
  }
  bd_info = (BitDepthInfo)
            (CONCAT44((uint)((x->e_mbd).cur_buf)->flags >> 3,(x->e_mbd).bd) & 0x1ffffffff);
  iVar1 = *(int *)((long)tx_size_high_unit + uVar6);
  iVar2 = *(int *)((long)tx_size_wide_unit + uVar6);
  cols = *(int *)((long)tx_size_wide + uVar6);
  rows = *(int *)((long)tx_size_high + uVar6);
  pmVar9 = x->plane + (uint)plane;
  lVar8 = 0;
  for (blk_row = 0; blk_row < (int)uVar5 >> 2; blk_row = blk_row + iVar1) {
    for (blk_col = 0; blk_col < (int)local_80 >> 2; blk_col = blk_col + iVar2) {
      av1_predict_intra_block_facade(cm,&x->e_mbd,plane,blk_col,blk_row,tx_size);
      iVar4 = (pmVar9->src).stride;
      iVar3 = (x->e_mbd).plane[(uint)plane].dst.stride;
      av1_subtract_block(bd_info,rows,cols,pmVar9->src_diff,(ulong)src_stride,
                         (pmVar9->src).buf + (iVar4 * blk_row + blk_col) * 4,(long)iVar4,
                         (x->e_mbd).plane[(uint)plane].dst.buf + (iVar3 * blk_row + blk_col) * 4,
                         (long)iVar3);
      av1_quick_txfm(use_hadamard,tx_size,bd_info,pmVar9->src_diff,src_stride,pmVar9->coeff);
      iVar4 = (*aom_satd)(pmVar9->coeff,
                          tx_size_2d[CONCAT71(in_register_00000081,tx_size) & 0xffffffff]);
      lVar8 = lVar8 + iVar4;
    }
  }
  return lVar8;
}

Assistant:

static int64_t intra_model_rd(const AV1_COMMON *cm, MACROBLOCK *const x,
                              int plane, BLOCK_SIZE plane_bsize,
                              TX_SIZE tx_size, int use_hadamard) {
  MACROBLOCKD *const xd = &x->e_mbd;
  const BitDepthInfo bd_info = get_bit_depth_info(xd);
  int row, col;
  assert(!is_inter_block(xd->mi[0]));
  const int stepr = tx_size_high_unit[tx_size];
  const int stepc = tx_size_wide_unit[tx_size];
  const int txbw = tx_size_wide[tx_size];
  const int txbh = tx_size_high[tx_size];
  const int max_blocks_wide = max_block_wide(xd, plane_bsize, plane);
  const int max_blocks_high = max_block_high(xd, plane_bsize, plane);
  int64_t satd_cost = 0;
  struct macroblock_plane *p = &x->plane[plane];
  struct macroblockd_plane *pd = &xd->plane[plane];
  // Prediction.
  for (row = 0; row < max_blocks_high; row += stepr) {
    for (col = 0; col < max_blocks_wide; col += stepc) {
      av1_predict_intra_block_facade(cm, xd, plane, col, row, tx_size);
      // Here we use p->src_diff and p->coeff as temporary buffers for
      // prediction residue and transform coefficients. The buffers are only
      // used in this for loop, therefore we don't need to properly add offset
      // to the buffers.
      av1_subtract_block(
          bd_info, txbh, txbw, p->src_diff, block_size_wide[plane_bsize],
          p->src.buf + (((row * p->src.stride) + col) << 2), p->src.stride,
          pd->dst.buf + (((row * pd->dst.stride) + col) << 2), pd->dst.stride);
      av1_quick_txfm(use_hadamard, tx_size, bd_info, p->src_diff,
                     block_size_wide[plane_bsize], p->coeff);
      satd_cost += aom_satd(p->coeff, tx_size_2d[tx_size]);
    }
  }
  return satd_cost;
}